

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall cmTarget::HandleLocationPropertyPolicy(cmTarget *this,cmMakefile *context)

{
  MessageType t;
  bool bVar1;
  PolicyStatus PVar2;
  ostream *poVar3;
  string *psVar4;
  PolicyID id;
  string local_1f8;
  string local_1d8;
  MessageType local_1a4;
  char *pcStack_1a0;
  MessageType messageType;
  char *modal;
  ostringstream e;
  cmMakefile *context_local;
  cmTarget *this_local;
  
  bVar1 = IsImported(this);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&modal);
    pcStack_1a0 = (char *)0x0;
    local_1a4 = AUTHOR_WARNING;
    PVar2 = cmMakefile::GetPolicyStatus(context,CMP0026);
    if (PVar2 != OLD) {
      if (PVar2 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1d8,(cmPolicies *)0x1a,id);
        poVar3 = std::operator<<((ostream *)&modal,(string *)&local_1d8);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string((string *)&local_1d8);
        pcStack_1a0 = "should";
      }
      else if (PVar2 - NEW < 3) {
        pcStack_1a0 = "may";
        local_1a4 = FATAL_ERROR;
      }
    }
    if (pcStack_1a0 != (char *)0x0) {
      poVar3 = std::operator<<((ostream *)&modal,"The LOCATION property ");
      poVar3 = std::operator<<(poVar3,pcStack_1a0);
      poVar3 = std::operator<<(poVar3," not be read from target \"");
      psVar4 = GetName_abi_cxx11_(this);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      std::operator<<(poVar3,
                      "\".  Use the target name directly with add_custom_command, or use the generator expression $<TARGET_FILE>, as appropriate.\n"
                     );
      t = local_1a4;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(context,t,&local_1f8,false);
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    this_local._7_1_ = local_1a4 != FATAL_ERROR;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&modal);
  }
  return this_local._7_1_;
}

Assistant:

bool cmTarget::HandleLocationPropertyPolicy(cmMakefile* context) const
{
  if (this->IsImported())
    {
    return true;
    }
  std::ostringstream e;
  const char *modal = 0;
  cmake::MessageType messageType = cmake::AUTHOR_WARNING;
  switch (context->GetPolicyStatus(cmPolicies::CMP0026))
    {
    case cmPolicies::WARN:
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0026) << "\n";
      modal = "should";
    case cmPolicies::OLD:
      break;
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::NEW:
      modal = "may";
      messageType = cmake::FATAL_ERROR;
    }

  if (modal)
    {
    e << "The LOCATION property " << modal << " not be read from target \""
      << this->GetName() << "\".  Use the target name directly with "
      "add_custom_command, or use the generator expression $<TARGET_FILE>, "
      "as appropriate.\n";
    context->IssueMessage(messageType, e.str());
    }

  return messageType != cmake::FATAL_ERROR;
}